

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cxx
# Opt level: O3

int read_file(char *filename,int merge)

{
  Fl_Type *pFVar1;
  int iVar2;
  uint uVar3;
  FILE *pFVar4;
  Fl_Type *pFVar5;
  Fl_Type *pFVar6;
  
  read_version = 0.0;
  lineno = 1;
  if (filename == (char *)0x0) {
    filename = "stdin";
    pFVar4 = _stdin;
  }
  else {
    pFVar4 = fl_fopen(filename,"r");
    if (pFVar4 == (FILE *)0x0) {
      return 0;
    }
  }
  fin = pFVar4;
  fname = filename;
  if (merge == 0) {
    merge = 0;
    delete_all(0);
  }
  else {
    deselect();
  }
  read_children(Fl_Type::current,merge);
  Fl_Type::current = (Fl_Type *)0x0;
  pFVar6 = Fl_Type::first;
  pFVar1 = Fl_Type::current;
  if (Fl_Type::first != (Fl_Type *)0x0) {
    do {
      iVar2 = (*pFVar6->_vptr_Fl_Type[0x1f])(pFVar6);
      if (iVar2 != 0) {
        (*pFVar6->_vptr_Fl_Type[8])(pFVar6,0,0);
      }
      pFVar6 = pFVar6->next;
      pFVar5 = Fl_Type::first;
    } while (pFVar6 != (Fl_Type *)0x0);
    for (; (pFVar1 = Fl_Type::current, pFVar5 != (Fl_Type *)0x0 &&
           (pFVar1 = pFVar5, pFVar5->selected == '\0')); pFVar5 = pFVar5->next) {
    }
  }
  Fl_Type::current = pFVar1;
  selection_changed(Fl_Type::current);
  if (fin == _stdin) {
    uVar3 = 1;
  }
  else {
    uVar3 = fclose((FILE *)fin);
    fin = (FILE *)0x0;
    uVar3 = ~uVar3 >> 0x1f;
  }
  return uVar3;
}

Assistant:

int read_file(const char *filename, int merge) {
  Fl_Type *o;
  read_version = 0.0;
  if (!open_read(filename)) return 0;
  if (merge) deselect(); else    delete_all();
  read_children(Fl_Type::current, merge);
  Fl_Type::current = 0;
  // Force menu items to be rebuilt...
  for (o = Fl_Type::first; o; o = o->next)
    if (o->is_menu_button()) o->add_child(0,0);
  for (o = Fl_Type::first; o; o = o->next)
    if (o->selected) {Fl_Type::current = o; break;}
  selection_changed(Fl_Type::current);
  return close_read();
}